

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignumlib.cpp
# Opt level: O0

void __thiscall CVmObjBigNum::wp8abs(CVmObjBigNum *this,char *buf,int *ov)

{
  int iVar1;
  uint32_t uVar2;
  uint *in_RDX;
  void *in_RSI;
  uint32_t hi;
  uint32_t lo;
  char tmp [25];
  uint in_stack_ffffffffffffffc4;
  undefined1 uVar3;
  undefined7 in_stack_ffffffffffffffe1;
  
  iVar1 = get_exp((char *)0x316505);
  *in_RDX = (uint)(0x1e < iVar1);
  uVar3 = 0;
  copy_val((char *)0x0,(char *)0x14,in_stack_ffffffffffffffc4);
  div_by_2e32((char *)tmp._0_8_,_hi);
  uVar2 = convert_to_int_base((char *)in_RDX,(int *)CONCAT71(in_stack_ffffffffffffffe1,uVar3));
  ::oswp4(in_RSI,(ulong)in_stack_ffffffffffffffc4);
  ::oswp4((void *)((long)in_RSI + 4),(ulong)uVar2);
  return;
}

Assistant:

void CVmObjBigNum::wp8abs(char *buf, int &ov) const
{
    /* 
     *   as a rough cut, if the number is greater than 10^30, it's definitely
     *   too big for a 64-bit integer buffer 
     */
    ov = (get_exp(ext_) > 30);

    /* 
     *   Make a local copy of the value - we need at most 20 digits of
     *   precision, since we only want the integer part.  
     */
    char tmp[5 + 20] = { 20, 0, 0, 0, 0 };
    copy_val(tmp, ext_, TRUE);

    /* 
     *   Divide the value by 2^32.  This splits the value into two 32-bit
     *   halves for us, which are then easy to arrange into the buffer with
     *   integer arithmetic.  
     */
    uint32_t lo, hi;
    div_by_2e32(tmp, &lo);
    hi = convert_to_int_base(tmp, ov);

    /* 
     *   store the low part in the first four bytes, the high part in the
     *   next four bytes 
     */
    oswp4(buf, lo);
    oswp4(buf + 4, hi);
}